

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typeop.cc
# Opt level: O0

void __thiscall TypeOpInsert::TypeOpInsert(TypeOpInsert *this,TypeFactory *t)

{
  OpBehavior *this_00;
  allocator local_39;
  string local_38 [32];
  TypeFactory *local_18;
  TypeFactory *t_local;
  TypeOpInsert *this_local;
  
  local_18 = t;
  t_local = (TypeFactory *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,"INSERT",&local_39);
  TypeOpFunc::TypeOpFunc
            (&this->super_TypeOpFunc,t,CPUI_INSERT,(string *)local_38,TYPE_UNKNOWN,TYPE_INT);
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  (this->super_TypeOpFunc).super_TypeOp._vptr_TypeOp = (_func_int **)&PTR_setMetatypeIn_0084c058;
  (this->super_TypeOpFunc).super_TypeOp.opflags = 0x20000;
  this_00 = (OpBehavior *)operator_new(0x10);
  OpBehavior::OpBehavior(this_00,CPUI_INSERT,false,true);
  (this->super_TypeOpFunc).super_TypeOp.behave = this_00;
  return;
}

Assistant:

TypeOpInsert::TypeOpInsert(TypeFactory *t)
  : TypeOpFunc(t,CPUI_INSERT,"INSERT",TYPE_UNKNOWN,TYPE_INT)
{
  opflags = PcodeOp::special;
  behave = new OpBehavior(CPUI_INSERT,false,true);	// Dummy behavior
}